

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

SourceFetchProc getSourceFetch(TextureBlendType blendType,Format format)

{
  Format format_local;
  TextureBlendType blendType_local;
  SourceFetchProc local_8;
  
  if ((format == Format_RGB32) || (format == Format_ARGB32_Premultiplied)) {
    local_8 = sourceFetchARGB32PM[blendType];
  }
  else if ((blendType == BlendUntransformed) || (blendType == BlendTiled)) {
    local_8 = sourceFetchUntransformed[format];
  }
  else if (qPixelLayouts[format].bpp == BPP16) {
    local_8 = sourceFetchAny16[blendType];
  }
  else if (qPixelLayouts[format].bpp == BPP32) {
    local_8 = sourceFetchAny32[blendType];
  }
  else {
    local_8 = sourceFetchGeneric[blendType];
  }
  return local_8;
}

Assistant:

static inline SourceFetchProc getSourceFetch(TextureBlendType blendType, QImage::Format format)
{
    if (format == QImage::Format_RGB32 || format == QImage::Format_ARGB32_Premultiplied)
        return sourceFetchARGB32PM[blendType];
    if (blendType == BlendUntransformed || blendType == BlendTiled)
        return sourceFetchUntransformed[format];
    if (qPixelLayouts[format].bpp == QPixelLayout::BPP16)
        return sourceFetchAny16[blendType];
    if (qPixelLayouts[format].bpp == QPixelLayout::BPP32)
        return sourceFetchAny32[blendType];
    return sourceFetchGeneric[blendType];
}